

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  int iVar1;
  secp256k1_ge *in_RDX;
  secp256k1_scalar *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  int ret;
  secp256k1_scalar seckey_scalar;
  secp256k1_ge p;
  secp256k1_ge *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 uVar2;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  uVar2 = 0;
  if (in_RSI == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff60,
               (char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar1 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                 (char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else if (in_RDX == (secp256k1_ge *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                 (char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else {
      local_4 = secp256k1_ec_pubkey_create_helper(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      secp256k1_pubkey_save
                ((secp256k1_pubkey *)CONCAT44(local_4,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      secp256k1_memczero(in_RSI,0x40,(uint)((local_4 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)0x474dc9);
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    secp256k1_memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}